

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flops.cc
# Opt level: O0

float __thiscall benchmark_9::run_kernel(benchmark_9 *this,size_t iterations)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m256 x;
  undefined1 auVar4 [32];
  ulong uVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  long in_RSI;
  long in_RDI;
  uint uVar9;
  float fVar10;
  undefined1 in_ZMM0 [64];
  __m256 r8;
  __m256 r7;
  __m256 r6;
  __m256 r5;
  __m256 r4;
  __m256 r3;
  __m256 r2;
  __m256 r1;
  __m256 r0;
  undefined8 uStack_928;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined8 local_818;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  
  uVar1 = rdtsc();
  uVar6 = (uint)((ulong)uVar1 >> 0x20);
  uVar5 = CONCAT44((int)((ulong)in_RDI >> 0x20),(int)uVar1) | (ulong)uVar6 << 0x20;
  auVar3 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,uVar5);
  uVar9 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar9),ZEXT416(uVar9),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar9),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar9),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar9),ZEXT416(uVar9),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar9),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar9),0x30);
  local_840._16_16_ = auVar2;
  local_840._0_16_ = auVar3;
  uVar1 = rdtsc();
  uVar7 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar5 = CONCAT44((int)(uVar5 >> 0x20),(int)uVar1) | CONCAT44(uVar6,uVar7) << 0x20;
  auVar3 = vcvtusi2ss_avx512f(auVar3,uVar5);
  uVar6 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar6),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar6),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar6),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar6),0x30);
  local_860._16_16_ = auVar2;
  local_860._0_16_ = auVar3;
  uVar1 = rdtsc();
  uVar8 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar5 = CONCAT44((int)(uVar5 >> 0x20),(int)uVar1) | CONCAT44(uVar7,uVar8) << 0x20;
  auVar3 = vcvtusi2ss_avx512f(auVar3,uVar5);
  uVar6 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar6),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar6),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar6),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar6),0x30);
  local_880._16_16_ = auVar2;
  local_880._0_16_ = auVar3;
  uVar1 = rdtsc();
  uVar7 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar5 = CONCAT44((int)(uVar5 >> 0x20),(int)uVar1) | CONCAT44(uVar8,uVar7) << 0x20;
  auVar3 = vcvtusi2ss_avx512f(auVar3,uVar5);
  uVar6 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar6),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar6),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar6),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar6),0x30);
  local_8a0._16_16_ = auVar2;
  local_8a0._0_16_ = auVar3;
  uVar1 = rdtsc();
  uVar8 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar5 = CONCAT44((int)(uVar5 >> 0x20),(int)uVar1) | CONCAT44(uVar7,uVar8) << 0x20;
  auVar3 = vcvtusi2ss_avx512f(auVar3,uVar5);
  uVar6 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar6),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar6),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar6),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar6),0x30);
  local_8c0._16_16_ = auVar2;
  local_8c0._0_16_ = auVar3;
  uVar1 = rdtsc();
  uVar7 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar5 = CONCAT44((int)(uVar5 >> 0x20),(int)uVar1) | CONCAT44(uVar8,uVar7) << 0x20;
  auVar3 = vcvtusi2ss_avx512f(auVar3,uVar5);
  uVar6 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar6),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar6),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar6),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar6),0x30);
  local_8e0._16_16_ = auVar2;
  local_8e0._0_16_ = auVar3;
  uVar1 = rdtsc();
  uVar8 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar5 = CONCAT44((int)(uVar5 >> 0x20),(int)uVar1) | CONCAT44(uVar7,uVar8) << 0x20;
  auVar3 = vcvtusi2ss_avx512f(auVar3,uVar5);
  uVar6 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar6),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar6),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar6),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar6),0x30);
  local_900._16_16_ = auVar2;
  local_900._0_16_ = auVar3;
  uVar1 = rdtsc();
  uVar7 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar5 = CONCAT44((int)(uVar5 >> 0x20),(int)uVar1) | CONCAT44(uVar8,uVar7) << 0x20;
  auVar3 = vcvtusi2ss_avx512f(auVar3,uVar5);
  uVar6 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar6),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar6),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar6),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar6),0x30);
  local_920._16_16_ = auVar2;
  local_920._0_16_ = auVar3;
  uVar1 = rdtsc();
  auVar3 = vcvtusi2ss_avx512f(auVar3,CONCAT44((int)(uVar5 >> 0x20),(int)uVar1) |
                                     CONCAT44(uVar7,(int)((ulong)uVar1 >> 0x20)) << 0x20);
  uVar9 = auVar3._0_4_;
  auVar3 = vinsertps_avx(ZEXT416(uVar9),ZEXT416(uVar9),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar9),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar9),0x30);
  auVar2 = vinsertps_avx(ZEXT416(uVar9),ZEXT416(uVar9),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar9),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(uVar9),0x30);
  local_5e0 = auVar2._0_8_;
  uStack_5d8 = auVar2._8_8_;
  uStack_5d0 = auVar3._0_8_;
  uStack_5c8 = auVar3._8_8_;
  uStack_928 = uStack_5c8;
  local_818 = in_RSI;
  do {
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),local_840);
    local_840 = ZEXT1632(auVar3);
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),local_860);
    local_860 = ZEXT1632(auVar3);
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),local_880);
    local_880 = ZEXT1632(auVar3);
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),local_8a0);
    local_8a0 = ZEXT1632(auVar3);
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),local_8c0);
    local_8c0 = ZEXT1632(auVar3);
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),local_8e0);
    local_8e0 = ZEXT1632(auVar3);
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),local_900);
    local_900 = ZEXT1632(auVar3);
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),local_920);
    local_920 = ZEXT1632(auVar3);
    auVar4._8_8_ = uStack_5d8;
    auVar4._0_8_ = local_5e0;
    auVar4._16_8_ = uStack_5d0;
    auVar4._24_8_ = uStack_928;
    auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(in_RDI + 0x40),
                             *(undefined1 (*) [32])(in_RDI + 0x20),auVar4);
    local_5e0 = auVar3._0_8_;
    uStack_5d8 = auVar3._8_8_;
    uStack_5d0 = 0;
    uStack_928 = 0;
    local_818 = local_818 + -1;
  } while (local_818 != 0);
  x[1] = (float)uVar9;
  x[0] = (float)uVar6;
  x[2] = (float)(int)local_5e0;
  x[3] = (float)(int)((ulong)local_5e0 >> 0x20);
  x[4] = (float)(int)uStack_5d8;
  x[5] = (float)(int)((ulong)uStack_5d8 >> 0x20);
  x[6] = 0.0;
  x[7] = 0.0;
  fVar10 = __m256_reduce_add_ps(x);
  return fVar10;
}

Assistant:

float run_kernel(size_t iterations) const override
    {
            __m256 r0 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r1 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r2 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r3 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r4 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r5 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r6 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r7 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            __m256 r8 = _mm256_set1_ps((float) __builtin_ia32_rdtsc());
            do{
                r0 = _mm256_fmadd_ps(mul0, mul1, r0);
                r1 = _mm256_fmadd_ps(mul0, mul1, r1);
                r2 = _mm256_fmadd_ps(mul0, mul1, r2);
                r3 = _mm256_fmadd_ps(mul0, mul1, r3);
                r4 = _mm256_fmadd_ps(mul0, mul1, r4);
                r5 = _mm256_fmadd_ps(mul0, mul1, r5);
                r6 = _mm256_fmadd_ps(mul0, mul1, r6);
                r7 = _mm256_fmadd_ps(mul0, mul1, r7);
                r8 = _mm256_fmadd_ps(mul0, mul1, r8);

            }while (--iterations);

            r0 = _mm256_add_ps(r0, r4);
            r1 = _mm256_add_ps(r1, r5);
            r2 = _mm256_add_ps(r2, r6);
            r3 = _mm256_add_ps(r3, r7);

            r0 = _mm256_add_ps(r0, r1);
            r2 = _mm256_add_ps(r2, r3);
            
            r0 = _mm256_add_ps(r0, r8);
            r0 = _mm256_add_ps(r0, r2);
            return __m256_reduce_add_ps(r0);
    }